

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::DrawInstancedGeometryInstancedCase::init
          (DrawInstancedGeometryInstancedCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  InstancedExpansionShader *this_00;
  RenderContext *pRVar2;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_1a8;
  ContextType local_14;
  DrawInstancedGeometryInstancedCase *local_10;
  DrawInstancedGeometryInstancedCase *this_local;
  
  local_10 = this;
  this_00 = (InstancedExpansionShader *)operator_new(0x158);
  pRVar2 = Context::getRenderContext
                     ((this->super_GeometryShaderRenderTest).super_TestCase.m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  InstancedExpansionShader::InstancedExpansionShader(this_00,&local_14,this->m_numInvocations);
  this->m_program = this_00;
  this_01 = tcu::TestContext::getLog
                      ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [31])"Rendering a single point with ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_numInstances);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" instances. ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [33])"Each geometry shader is invoked ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_numInvocations);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [28])" times for each primitive. ");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  iVar1 = GeometryShaderRenderTest::init(&this->super_GeometryShaderRenderTest,ctx_00);
  return iVar1;
}

Assistant:

void DrawInstancedGeometryInstancedCase::init (void)
{
	m_program = new InstancedExpansionShader(m_context.getRenderContext().getType(), m_numInvocations);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering a single point with " << m_numInstances << " instances. "
		<< "Each geometry shader is invoked " << m_numInvocations << " times for each primitive. "
		<< tcu::TestLog::EndMessage;

	GeometryShaderRenderTest::init();
}